

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLParser.cxx
# Opt level: O2

int __thiscall cmXMLParser::InitializeParser(cmXMLParser *this)

{
  ostream *poVar1;
  XML_Parser parser;
  bool bVar2;
  
  bVar2 = this->Parser == (void *)0x0;
  if (bVar2) {
    parser = XML_ParserCreate((XML_Char *)0x0);
    this->Parser = parser;
    XML_SetElementHandler(parser,cmXMLParserStartElement,cmXMLParserEndElement);
    XML_SetCharacterDataHandler((XML_Parser)this->Parser,cmXMLParserCharacterDataHandler);
    XML_SetUserData((XML_Parser)this->Parser,this);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Parser already initialized");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  this->ParseError = (uint)!bVar2;
  return (uint)bVar2;
}

Assistant:

int cmXMLParser::InitializeParser()
{
  if (this->Parser) {
    std::cerr << "Parser already initialized" << std::endl;
    this->ParseError = 1;
    return 0;
  }

  // Create the expat XML parser.
  this->Parser = XML_ParserCreate(nullptr);
  XML_SetElementHandler(static_cast<XML_Parser>(this->Parser),
                        &cmXMLParserStartElement, &cmXMLParserEndElement);
  XML_SetCharacterDataHandler(static_cast<XML_Parser>(this->Parser),
                              &cmXMLParserCharacterDataHandler);
  XML_SetUserData(static_cast<XML_Parser>(this->Parser), this);
  this->ParseError = 0;
  return 1;
}